

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O0

size_t adios2::core::engine::ssc::TotalDataSize(BlockVec *bv)

{
  bool bVar1;
  size_t sVar2;
  BlockInfo *b;
  const_iterator __end3;
  const_iterator __begin3;
  BlockVec *__range3;
  size_t s;
  ShapeID *in_stack_000000a8;
  size_t in_stack_000000b0;
  Dims *in_stack_000000b8;
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  *in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  local_20 [2];
  size_t local_10;
  
  local_10 = 0;
  local_20[0]._M_current =
       (BlockInfo *)
       std::
       vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
       ::begin(in_stack_ffffffffffffffc8);
  std::
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
         ::operator*(local_20);
    if (in_stack_ffffffffffffffd0->type == String) {
      local_10 = in_stack_ffffffffffffffd0->bufferCount + local_10;
    }
    else {
      sVar2 = TotalDataSize(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
      local_10 = sVar2 + local_10;
    }
    __gnu_cxx::
    __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
    ::operator++(local_20);
  }
  return local_10;
}

Assistant:

size_t TotalDataSize(const BlockVec &bv)
{
    size_t s = 0;
    for (const auto &b : bv)
    {
        if (b.type == DataType::String)
        {
            s += b.bufferCount;
        }
        else
        {
            s += TotalDataSize(b.count, b.elementSize, b.shapeId);
        }
    }
    return s;
}